

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O2

void __thiscall draco::PointAttribute::CopyFrom(PointAttribute *this,PointAttribute *src_att)

{
  AttributeTransformData *data;
  bool bVar1;
  tuple<draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_> in_RAX;
  DataBuffer *this_00;
  AttributeTransformData *this_01;
  pointer __p_1;
  pointer __p;
  __uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> local_28;
  
  local_28._M_t.super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
  .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl =
       (tuple<draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>)
       (tuple<draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>)
       in_RAX.super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
       super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl;
  if ((this->attribute_buffer_)._M_t.
      super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
      super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
      super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl == (DataBuffer *)0x0) {
    this_00 = (DataBuffer *)operator_new(0x28);
    DataBuffer::DataBuffer(this_00);
    local_28._M_t.
    super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
    super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl =
         (tuple<draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>)
         (_Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>)0x0;
    std::__uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::reset
              ((__uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)
               &this->attribute_buffer_,this_00);
    std::unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::~unique_ptr
              ((unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)&local_28);
    GeometryAttribute::ResetBuffer
              (&this->super_GeometryAttribute,
               (this->attribute_buffer_)._M_t.
               super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>.
               _M_t.
               super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
               super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl,0,0);
  }
  bVar1 = GeometryAttribute::CopyFrom
                    (&this->super_GeometryAttribute,&src_att->super_GeometryAttribute);
  if (bVar1) {
    this->identity_mapping_ = src_att->identity_mapping_;
    this->num_unique_entries_ = src_att->num_unique_entries_;
    std::
    vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ::operator=(&(this->indices_map_).vector_,&(src_att->indices_map_).vector_);
    data = (src_att->attribute_transform_data_)._M_t.
           super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
           .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl;
    if (data == (AttributeTransformData *)0x0) {
      std::
      __uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
      ::reset((__uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
               *)&this->attribute_transform_data_,(pointer)0x0);
    }
    else {
      this_01 = (AttributeTransformData *)operator_new(0x30);
      AttributeTransformData::AttributeTransformData(this_01,data);
      local_28._M_t.
      super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
      super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl =
           (tuple<draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>)
           (_Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>)0x0;
      std::
      __uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
      ::reset((__uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
               *)&this->attribute_transform_data_,this_01);
      std::
      unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
      ::~unique_ptr((unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
                     *)&local_28);
    }
  }
  return;
}

Assistant:

void PointAttribute::CopyFrom(const PointAttribute &src_att) {
  if (buffer() == nullptr) {
    // If the destination attribute doesn't have a valid buffer, create it.
    attribute_buffer_ = std::unique_ptr<DataBuffer>(new DataBuffer());
    ResetBuffer(attribute_buffer_.get(), 0, 0);
  }
  if (!GeometryAttribute::CopyFrom(src_att)) {
    return;
  }
  identity_mapping_ = src_att.identity_mapping_;
  num_unique_entries_ = src_att.num_unique_entries_;
  indices_map_ = src_att.indices_map_;
  if (src_att.attribute_transform_data_) {
    attribute_transform_data_ = std::unique_ptr<AttributeTransformData>(
        new AttributeTransformData(*src_att.attribute_transform_data_));
  } else {
    attribute_transform_data_ = nullptr;
  }
}